

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax_n_helpers.hpp
# Opt level: O2

void duckdb::MinMaxNOperation::
     Combine<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<double>,duckdb::MinMaxFixedValue<float>,duckdb::LessThan>,duckdb::MinMaxNOperation>
               (ArgMinMaxNState<duckdb::MinMaxFixedValue<double>,_duckdb::MinMaxFixedValue<float>,_duckdb::LessThan>
                *source,ArgMinMaxNState<duckdb::MinMaxFixedValue<double>,_duckdb::MinMaxFixedValue<float>,_duckdb::LessThan>
                        *target,AggregateInputData *aggr_input)

{
  InvalidInputException *this;
  allocator local_41;
  string local_40;
  
  if (source->is_initialized != true) {
    return;
  }
  if (target->is_initialized == false) {
    ArgMinMaxNState<duckdb::MinMaxFixedValue<double>,_duckdb::MinMaxFixedValue<float>,_duckdb::LessThan>
    ::Initialize(target,aggr_input->allocator,(source->heap).capacity);
  }
  else if ((source->heap).capacity != (target->heap).capacity) {
    this = (InvalidInputException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_40,"Mismatched n values in min/max/arg_min/arg_max",&local_41);
    InvalidInputException::InvalidInputException(this,&local_40);
    __cxa_throw(this,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  BinaryAggregateHeap<float,_double,_duckdb::LessThan>::Insert
            (&target->heap,aggr_input->allocator,&source->heap);
  return;
}

Assistant:

static void Combine(const STATE &source, STATE &target, AggregateInputData &aggr_input) {
		if (!source.is_initialized) {
			// source is empty, nothing to do
			return;
		}

		if (!target.is_initialized) {
			target.Initialize(aggr_input.allocator, source.heap.Capacity());
		} else if (source.heap.Capacity() != target.heap.Capacity()) {
			throw InvalidInputException("Mismatched n values in min/max/arg_min/arg_max");
		}

		// Merge the heaps
		target.heap.Insert(aggr_input.allocator, source.heap);
	}